

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_valueiterator.cpp
# Opt level: O0

Value __thiscall Json::ValueIteratorBase::key(ValueIteratorBase *this)

{
  bool bVar1;
  reference other;
  char *pcVar2;
  int __c;
  undefined8 extraout_RDX;
  _Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *in_RSI;
  Value VVar3;
  StaticString local_30;
  undefined1 local_28 [8];
  CZString czstring;
  ValueIteratorBase *this_local;
  
  other = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                    (in_RSI);
  Value::CZString::CZString((CZString *)local_28,&other->first);
  pcVar2 = Value::CZString::c_str((CZString *)local_28);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = Value::CZString::index((CZString *)local_28,(char *)other,__c);
    Value::Value((Value *)this,(Int)pcVar2);
  }
  else {
    bVar1 = Value::CZString::isStaticString((CZString *)local_28);
    if (bVar1) {
      pcVar2 = Value::CZString::c_str((CZString *)local_28);
      StaticString::StaticString(&local_30,pcVar2);
      Value::Value((Value *)this,&local_30);
    }
    else {
      pcVar2 = Value::CZString::c_str((CZString *)local_28);
      Value::Value((Value *)this,pcVar2);
    }
  }
  Value::CZString::~CZString((CZString *)local_28);
  VVar3._8_8_ = extraout_RDX;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Value
ValueIteratorBase::key () const
{
    const Value::CZString czstring = (*current_).first;

    if ( czstring.c_str () )
    {
        if ( czstring.isStaticString () )
            return Value ( StaticString ( czstring.c_str () ) );

        return Value ( czstring.c_str () );
    }

    return Value ( czstring.index () );
}